

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

vector3 * vector3_reflect_by_quaternion(vector3 *self,quaternion *qT)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  anon_union_16_3_07544b10_for_quaternion_0 local_28;
  
  fVar8 = (qT->field_0).q[0];
  fVar1 = (qT->field_0).q[3];
  fVar5 = -(qT->field_0).q[2];
  fVar4 = -(qT->field_0).q[1];
  uVar3 = *(undefined8 *)((long)&self->field_0 + 4);
  fVar2 = (self->field_0).v[0];
  fVar11 = (float)uVar3;
  fVar12 = (float)((ulong)uVar3 >> 0x20);
  local_28.q[0] = fVar11 * fVar5 + fVar2 * fVar1 + (qT->field_0).q[1] * fVar12;
  local_28.q[1] = fVar2 * (qT->field_0).q[2] + fVar11 * fVar1 + -fVar8 * fVar12;
  local_28.q[2] = fVar2 * fVar4 + fVar12 * fVar1 + fVar8 * fVar11;
  local_28.q[3] = fVar12 * fVar5 + fVar2 * fVar8 + fVar4 * fVar11;
  quaternion_multiply((quaternion *)&local_28.field_1,qT);
  auVar6._4_4_ = local_28.q[1];
  auVar6._0_4_ = local_28.q[0];
  fVar8 = SQRT(local_28.q[3] * local_28.q[3] +
               local_28.q[2] * local_28.q[2] +
               local_28.q[0] * local_28.q[0] + local_28.q[1] * local_28.q[1]);
  auVar6._8_8_ = 0;
  auVar7._4_4_ = fVar8;
  auVar7._0_4_ = fVar8;
  auVar7._8_8_ = 0;
  auVar7 = divps(auVar6,auVar7);
  if (1e-05 <= fVar8) {
    local_28.q[2] = local_28.q[2] / fVar8;
  }
  uVar9 = (int)((uint)(1e-05 <= fVar8) << 0x1f) >> 0x1f;
  uVar10 = (int)((uint)(1e-05 <= fVar8) << 0x1f) >> 0x1f;
  *(ulong *)&self->field_0 =
       CONCAT44(~uVar10 & (uint)local_28.q[1],~uVar9 & (uint)local_28.q[0]) |
       CONCAT44(auVar7._4_4_ & uVar10,auVar7._0_4_ & uVar9);
  (self->field_0).v[2] = local_28.q[2];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_reflect_by_quaternion(struct vector3 *self, const struct quaternion *qT)
{
	struct quaternion q;

	quaternion_set(&q, qT);
	quaternion_multiplyv3(&q, self);
	quaternion_multiply(&q, qT);

	/* this seems to be necessary */
	quaternion_normalize(&q);

	self->x = q.x;
	self->y = q.y;
	self->z = q.z;

	return self;
}